

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O1

ngram_model_t * ngram_model_set_remove(ngram_model_t *base,char *name,int reuse_widmap)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  uint32 *puVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ngram_model_t *pnVar11;
  uint n;
  long lVar12;
  float64 fVar13;
  
  uVar3 = base[1].refcount;
  if ((int)uVar3 < 1) {
    uVar10 = 0;
  }
  else {
    lVar12 = *(long *)&base[1].n_1g_alloc;
    uVar10 = 0;
    do {
      iVar6 = strcmp(name,*(char **)(lVar12 + uVar10 * 8));
      if (iVar6 == 0) goto LAB_0012eb93;
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
    uVar10 = (ulong)uVar3;
  }
LAB_0012eb93:
  n = 0;
  if ((uint)uVar10 == uVar3) {
    pnVar11 = (ngram_model_t *)0x0;
  }
  else {
    uVar9 = uVar10 & 0xffffffff;
    pnVar11 = *(ngram_model_t **)(base[1].n_counts + uVar9 * 2);
    fVar13 = logmath_exp(base->lmath,*(int *)(*(long *)&base[1].n + uVar9 * 4));
    iVar7 = logmath_log(base->lmath,(float64)(1.0 - (double)(float)(double)fVar13));
    base[1].refcount = base[1].refcount + -1;
    ckd_free(*(void **)(*(long *)&base[1].n_1g_alloc + uVar9 * 8));
    *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar9 * 8) = 0;
    iVar6 = base[1].refcount;
    if (0 < iVar6) {
      uVar8 = 0;
      n = 0;
      do {
        if (uVar9 <= uVar8) {
          *(undefined8 *)(base[1].n_counts + uVar8 * 2) =
               *(undefined8 *)(base[1].n_counts + uVar8 * 2 + 2);
          *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar8 * 8) =
               *(undefined8 *)(*(long *)&base[1].n_1g_alloc + 8 + uVar8 * 8);
          *(undefined4 *)(*(long *)&base[1].n + uVar8 * 4) =
               *(undefined4 *)(*(long *)&base[1].n + 4 + uVar8 * 4);
        }
        piVar1 = (int *)(*(long *)&base[1].n + uVar8 * 4);
        *piVar1 = *piVar1 - iVar7;
        bVar2 = *(byte *)(*(long *)(base[1].n_counts + uVar8 * 2) + 0x18);
        if (n <= bVar2) {
          n = (uint)bVar2;
        }
        uVar8 = uVar8 + 1;
        iVar6 = base[1].refcount;
      } while ((long)uVar8 < (long)iVar6);
    }
    puVar4 = base[1].n_counts;
    (puVar4 + (long)iVar6 * 2)[0] = 0;
    (puVar4 + (long)iVar6 * 2)[1] = 0;
    *(int32 *)(*(long *)&base[1].n + (long)iVar6 * 4) = base->log_zero;
    if (reuse_widmap == 0) {
      build_widmap(base,base->lmath,n);
    }
    else if (0 < base->n_words) {
      lVar12 = 0;
      do {
        pvVar5 = (&((base[1].lmath)->t).table)[lVar12];
        memmove((void *)((long)pvVar5 + uVar9 * 4),(void *)((long)pvVar5 + uVar9 * 4 + 4),
                ((long)base[1].refcount - (long)(int)(uint)uVar10) * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 < base->n_words);
    }
  }
  return pnVar11;
}

Assistant:

ngram_model_t *
ngram_model_set_remove(ngram_model_t * base,
                       const char *name, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    ngram_model_t *submodel;
    int32 lmidx, scale, n, i;
    float32 fprob;

    for (lmidx = 0; lmidx < set->n_models; ++lmidx)
        if (0 == strcmp(name, set->names[lmidx]))
            break;
    if (lmidx == set->n_models)
        return NULL;
    submodel = set->lms[lmidx];

    /* Renormalize the interpolation weights by scaling them by
     * 1/(1-fprob) */
    fprob = (float32) logmath_exp(base->lmath, set->lweights[lmidx]);
    scale = logmath_log(base->lmath, 1.0 - fprob);

    /* Remove it from the array of lms, renormalize remaining weights,
     * and recalcluate n. */
    --set->n_models;
    n = 0;
    ckd_free(set->names[lmidx]);
    set->names[lmidx] = NULL;
    for (i = 0; i < set->n_models; ++i) {
        if (i >= lmidx) {
            set->lms[i] = set->lms[i + 1];
            set->names[i] = set->names[i + 1];
            set->lweights[i] = set->lweights[i + 1];
        }
        set->lweights[i] -= scale;
        if (set->lms[i]->n > n)
            n = set->lms[i]->n;
    }
    /* There's no need to shrink these arrays. */
    set->lms[set->n_models] = NULL;
    set->lweights[set->n_models] = base->log_zero;
    /* No need to shrink maphist either. */

    /* Reuse the existing word ID mapping if requested. */
    if (reuse_widmap) {
        /* Just go through and shrink each row. */
        for (i = 0; i < base->n_words; ++i) {
            memmove(set->widmap[i] + lmidx, set->widmap[i] + lmidx + 1,
                    (set->n_models - lmidx) * sizeof(**set->widmap));
        }
    }
    else {
        build_widmap(base, base->lmath, n);
    }
    return submodel;
}